

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ambient_light.cpp
# Opt level: O0

Light_SampleRes * embree::AmbientLight_sample(Light *super,DifferentialGeometry *dg,Vec2f *s)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined4 *in_RCX;
  long in_RDX;
  long in_RSI;
  Light_SampleRes *in_RDI;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Vec3fa localDir;
  AmbientLight *self;
  Light_SampleRes *res;
  Vec3fa dy;
  Vec3fa dx;
  Vec3fa dx1;
  Vec3fa dx0;
  __m128 r_2;
  __m128 a_6;
  vfloat4 c;
  vfloat4 b;
  vfloat4 a;
  vfloat4 c_1;
  vfloat4 b_1;
  vfloat4 a_1;
  vfloat4 c_4;
  vfloat4 b_3;
  vfloat4 a_4;
  vfloat4 c_2;
  vfloat4 b_2;
  vfloat4 a_2;
  __m128 mask;
  vfloat4 b1;
  vfloat4 a1;
  vfloat4 b0;
  vfloat4 a0;
  __m128 c_3;
  __m128 r;
  __m128 a_3;
  __m128 c_5;
  __m128 r_1;
  __m128 a_5;
  ulong local_1b48;
  ulong uStackY_1b40;
  Vec2f *in_stack_ffffffffffffe4e0;
  undefined8 local_1b18;
  undefined8 uStack_1b10;
  undefined1 local_1b08 [16];
  undefined8 local_1af8;
  undefined8 uStack_1af0;
  undefined8 local_1ae8;
  undefined8 uStack_1ae0;
  undefined4 local_1ad0;
  undefined4 local_1acc;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ac8;
  long local_1ab0;
  undefined4 *local_1aa8;
  long local_1aa0;
  undefined4 *local_1a88;
  undefined4 *local_1a80;
  undefined1 local_1a78 [16];
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  undefined1 local_1a58 [16];
  undefined8 local_1a48;
  undefined8 uStack_1a40;
  undefined1 local_1a38 [24];
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_1a20;
  undefined8 *local_1a18;
  undefined8 *local_1a10;
  undefined8 local_1a08;
  undefined8 uStack_1a00;
  undefined8 local_19f8;
  undefined8 uStack_19f0;
  ulong local_19e8;
  ulong uStack_19e0;
  undefined8 local_19d8;
  undefined8 uStack_19d0;
  ulong local_19c8;
  ulong uStack_19c0;
  ulong local_19b8;
  ulong uStack_19b0;
  undefined1 (*local_19a0) [16];
  undefined8 *local_1998;
  undefined8 *local_1980;
  Vec3fa *local_1978;
  undefined1 *local_1970;
  ulong local_1908;
  ulong uStack_1900;
  ulong *local_18f8;
  ulong *local_18f0;
  long local_18e8;
  ulong uStack_18e0;
  ulong *local_18d8;
  ulong *local_18d0;
  undefined1 *local_18b0;
  undefined1 *local_18a0;
  undefined1 *local_1890;
  float local_1884;
  undefined4 local_1880;
  float local_187c;
  ulong *local_1878;
  float local_186c;
  float local_1868;
  undefined4 local_1864;
  ulong *local_1860;
  ulong local_1858;
  ulong uStack_1850;
  undefined4 local_1848;
  float local_1844;
  float local_1840;
  undefined4 local_183c;
  ulong local_1838;
  ulong uStack_1830;
  float local_1828;
  undefined4 local_1824;
  float local_1820;
  undefined4 local_181c;
  ulong *local_1818;
  ulong *local_1810;
  long *local_1808;
  ulong *local_1800;
  ulong *local_17f8;
  ulong *local_17f0;
  undefined8 *local_17d0;
  undefined1 *local_17c8;
  undefined8 *local_17c0;
  float local_17b8;
  float fStack_17b4;
  float fStack_17b0;
  float fStack_17ac;
  float local_1788;
  float fStack_1784;
  float fStack_1780;
  float fStack_177c;
  ulong local_1778;
  ulong uStack_1770;
  ulong local_1768;
  ulong uStack_1760;
  ulong local_1758;
  ulong uStack_1750;
  ulong local_1748;
  ulong uStack_1740;
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  undefined8 *local_1720;
  float local_16f8;
  undefined4 uStack_16f4;
  float fStack_16f0;
  undefined4 uStack_16ec;
  ulong *local_16e0;
  undefined4 local_16d8;
  float fStack_16d4;
  float fStack_16d0;
  undefined4 uStack_16cc;
  long *local_16c0;
  float local_1628;
  undefined8 local_15f8;
  undefined8 uStack_15f0;
  undefined8 local_15e8;
  undefined8 uStack_15e0;
  undefined8 local_15d8;
  undefined8 uStack_15d0;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  long local_15b8;
  ulong uStack_15b0;
  long *local_15a0;
  undefined8 local_1598;
  undefined8 uStack_1590;
  ulong local_1588;
  ulong uStack_1580;
  undefined8 local_1578;
  undefined8 uStack_1570;
  undefined8 local_1568;
  undefined8 uStack_1560;
  undefined8 local_1558;
  undefined8 uStack_1550;
  ulong local_1548;
  ulong uStack_1540;
  ulong *local_1530;
  undefined8 local_1528;
  undefined8 uStack_1520;
  ulong local_1518;
  ulong uStack_1510;
  ulong *local_1500;
  long local_14f8;
  ulong uStack_14f0;
  long *local_14e8;
  ulong *local_14e0;
  undefined8 *local_14d8;
  long *local_14d0;
  undefined8 *local_14c8;
  ulong *local_14c0;
  undefined8 *local_14b8;
  long *local_14b0;
  undefined8 *local_14a8;
  undefined8 *local_14a0;
  ulong *local_1498;
  undefined8 *local_1490;
  float local_1488;
  float fStack_1484;
  float fStack_1480;
  float fStack_147c;
  undefined8 *local_1478;
  undefined8 *local_1470;
  ulong *local_1468;
  ulong *local_1460;
  float local_1458;
  undefined4 uStack_1454;
  float fStack_1450;
  undefined4 uStack_144c;
  ulong *local_1448;
  undefined8 *local_1440;
  undefined8 *local_1438;
  undefined8 *local_1430;
  float local_1428;
  float fStack_1424;
  float fStack_1420;
  float fStack_141c;
  undefined8 *local_1418;
  undefined8 *local_1410;
  long *local_1408;
  undefined8 *local_1400;
  float local_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  undefined8 *local_13e0;
  undefined8 *local_13d8;
  undefined8 *local_13d0;
  long *local_13c8;
  undefined8 *local_13c0;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  undefined8 *local_13a0;
  ulong *local_1398;
  undefined8 *local_1390;
  undefined8 local_1388;
  undefined8 uStack_1380;
  undefined8 *local_1370;
  undefined4 local_1368;
  undefined4 uStack_1364;
  undefined4 uStack_1360;
  undefined4 uStack_135c;
  float local_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  ulong local_1348;
  ulong uStack_1340;
  long local_1338;
  ulong uStack_1330;
  ulong *local_1328;
  long *local_1320;
  undefined8 *local_1318;
  long *local_1310;
  undefined8 *local_1308;
  undefined8 *local_1300;
  undefined8 *local_12f8;
  ulong *local_12f0;
  undefined8 *local_12e8;
  ulong *local_12e0;
  long *local_12d8;
  undefined8 *local_12d0;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  undefined8 *local_12b0;
  float local_12a8;
  float fStack_12a4;
  float fStack_12a0;
  float fStack_129c;
  long local_1298;
  ulong uStack_1290;
  long *local_1280;
  ulong *local_1278;
  undefined8 *local_1270;
  undefined8 local_1268;
  undefined8 uStack_1260;
  undefined8 *local_1250;
  float local_1248;
  float fStack_1244;
  float fStack_1240;
  float fStack_123c;
  ulong local_1238;
  ulong uStack_1230;
  ulong *local_1220;
  undefined8 local_1218;
  undefined8 uStack_1210;
  long local_1208;
  ulong uStack_1200;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  ulong local_11c8;
  ulong uStack_11c0;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  ulong local_11a8;
  ulong uStack_11a0;
  undefined8 *local_1118;
  undefined8 *local_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  float local_10ec;
  undefined8 *local_10e8;
  undefined8 *local_10e0;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 *local_10c8;
  undefined8 *local_10c0;
  float local_10b4;
  undefined8 *local_10b0;
  undefined8 *local_10a8;
  undefined8 *local_10a0;
  undefined8 *local_1098;
  undefined8 *local_1090;
  undefined8 *local_1088;
  undefined8 *local_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  undefined8 *local_1020;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  undefined8 *local_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined8 *local_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  undefined8 *local_f78;
  undefined8 *local_f70;
  undefined8 *local_f68;
  undefined8 *local_f60;
  undefined8 *local_f58;
  undefined8 *local_f50;
  undefined8 *local_f48;
  undefined8 *local_f40;
  float local_f38;
  float fStack_f34;
  float fStack_f30;
  float fStack_f2c;
  undefined8 *local_f28;
  undefined8 *local_f20;
  undefined8 *local_f18;
  undefined8 *local_f10;
  float local_f08;
  float fStack_f04;
  float fStack_f00;
  float fStack_efc;
  undefined8 *local_ef8;
  undefined8 *local_ef0;
  undefined8 *local_ee8;
  undefined8 *local_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 *local_ec0;
  float local_eb8;
  float fStack_eb4;
  float fStack_eb0;
  float fStack_eac;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 *local_e90;
  undefined8 *local_e88;
  undefined8 *local_e80;
  undefined8 *local_e78;
  undefined8 *local_e70;
  undefined8 *local_e68;
  undefined8 *local_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 *local_e40;
  float local_e38;
  float fStack_e34;
  float fStack_e30;
  float fStack_e2c;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 *local_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  float local_dc8;
  float fStack_dc4;
  float fStack_dc0;
  float fStack_dbc;
  float local_dac;
  ulong *local_da8;
  undefined8 *local_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  float local_d7c;
  ulong *local_d78;
  undefined8 *local_d70;
  undefined8 local_d68;
  ulong uStack_d60;
  ulong *local_d58;
  ulong *local_d50;
  float local_d44;
  undefined8 *local_d40;
  ulong *local_d38;
  ulong *local_d30;
  undefined8 *local_d28;
  undefined8 *local_d20;
  ulong *local_d18;
  undefined8 *local_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  ulong local_cf8;
  ulong uStack_cf0;
  ulong local_ce8;
  ulong uStack_ce0;
  undefined8 local_cd8;
  ulong uStack_cd0;
  float local_cc8;
  float fStack_cc4;
  float fStack_cc0;
  float fStack_cbc;
  undefined8 *local_cb0;
  float local_ca8;
  float fStack_ca4;
  float fStack_ca0;
  undefined4 uStack_c9c;
  undefined8 *local_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  ulong uStack_c40;
  undefined8 *local_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  ulong uStack_c10;
  undefined8 *local_c08;
  undefined8 *local_c00;
  undefined8 *local_bf8;
  undefined8 *local_bf0;
  undefined8 *local_be8;
  undefined8 *local_be0;
  undefined8 *local_bd8;
  undefined8 *local_bd0;
  float local_bc8;
  float fStack_bc4;
  float fStack_bc0;
  float fStack_bbc;
  undefined8 *local_bb8;
  undefined8 *local_bb0;
  undefined8 *local_ba8;
  undefined8 *local_ba0;
  float local_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  undefined8 *local_b88;
  undefined8 *local_b80;
  undefined8 *local_b78;
  undefined8 *local_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 *local_b50;
  float local_b48;
  float fStack_b44;
  float fStack_b40;
  float fStack_b3c;
  undefined8 local_b38;
  ulong uStack_b30;
  undefined8 *local_b20;
  undefined8 *local_b18;
  undefined8 *local_b10;
  undefined8 *local_b08;
  undefined8 *local_b00;
  undefined8 *local_af8;
  undefined8 *local_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 *local_ad0;
  float local_ac8;
  float fStack_ac4;
  float fStack_ac0;
  float fStack_abc;
  undefined8 local_ab8;
  ulong uStack_ab0;
  undefined8 *local_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  ulong uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  float local_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float local_a3c;
  ulong local_a38;
  ulong uStack_a30;
  ulong *local_a28;
  ulong *local_a20;
  undefined1 local_a11;
  ulong *local_a10;
  ulong local_a08;
  ulong uStack_a00;
  ulong *local_9f0;
  undefined4 local_9e8;
  undefined4 uStack_9e4;
  undefined4 uStack_9e0;
  undefined4 uStack_9dc;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined1 local_9a8 [16];
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined1 local_978 [16];
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 *local_940;
  undefined1 (*local_938) [16];
  undefined8 *local_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 *local_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 *local_8f0;
  undefined1 *local_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 *local_8b0;
  undefined1 *local_898;
  undefined8 *local_890;
  undefined1 (*local_888) [16];
  undefined8 *local_880;
  undefined8 *local_878;
  undefined8 *local_870;
  ulong local_868;
  undefined8 uStack_860;
  undefined1 local_858 [16];
  ulong local_848;
  undefined8 uStack_840;
  float local_82c;
  undefined1 local_828 [16];
  undefined4 local_80c;
  undefined1 local_808 [16];
  undefined4 local_7ec;
  undefined1 local_7e8 [16];
  float local_7cc;
  ulong local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  ulong local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  ulong local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  ulong local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  ulong local_728;
  undefined8 uStack_720;
  ulong local_718;
  undefined8 uStack_710;
  undefined1 local_708 [16];
  ulong local_6f8;
  undefined8 uStack_6f0;
  float local_6dc;
  undefined1 local_6d8 [16];
  undefined4 local_6bc;
  undefined1 local_6b8 [16];
  undefined4 local_69c;
  undefined1 local_698 [16];
  float local_67c;
  ulong local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  ulong local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  ulong local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  ulong local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  ulong local_5d8;
  undefined8 uStack_5d0;
  ulong local_5c8;
  undefined8 uStack_5c0;
  ulong local_5b8;
  undefined8 uStack_5b0;
  ulong local_5a8;
  undefined8 uStack_5a0;
  ulong local_598;
  undefined8 uStack_590;
  ulong local_588;
  undefined8 uStack_580;
  ulong local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  ulong local_518;
  ulong uStack_510;
  ulong local_508;
  ulong uStack_500;
  ulong local_4f8;
  ulong uStack_4f0;
  ulong local_4e8;
  ulong uStack_4e0;
  ulong local_4d8;
  ulong uStack_4d0;
  ulong local_4c8;
  ulong uStack_4c0;
  ulong local_4b8;
  ulong uStack_4b0;
  ulong local_4a8;
  ulong uStack_4a0;
  ulong local_498;
  ulong uStack_490;
  undefined8 *local_488;
  undefined8 *local_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 *local_460;
  undefined1 local_458 [16];
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 *local_430;
  undefined8 *local_428;
  undefined8 *local_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 *local_400;
  undefined1 local_3f8 [16];
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 *local_3d0;
  undefined1 *local_3c8;
  undefined8 *local_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 *local_3a0;
  undefined1 local_398 [16];
  undefined1 *local_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 *local_350;
  undefined8 *local_348;
  undefined8 *local_340;
  undefined8 *local_338;
  undefined8 *local_330;
  undefined8 *local_328;
  undefined8 *local_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined8 *local_2e8;
  undefined8 *local_2e0;
  undefined8 *local_2d8;
  undefined1 *local_2d0;
  undefined8 *local_2c8;
  undefined8 *local_2c0;
  float fStack_2b4;
  float fStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined8 *local_288;
  undefined1 *local_280;
  undefined8 *local_278;
  undefined8 *local_270;
  undefined8 *local_268;
  undefined8 *local_260;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined8 *local_240;
  undefined8 *local_238;
  undefined8 *local_230;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined1 (*local_208) [16];
  undefined8 *local_200;
  undefined8 *local_1f8;
  undefined1 *local_1f0;
  undefined8 *local_1e8;
  undefined8 *local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 *local_1c0;
  undefined8 *local_1b8;
  undefined1 *local_1b0;
  undefined8 *local_1a8;
  undefined8 *local_1a0;
  undefined1 *local_198;
  undefined8 *local_190;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined8 *local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  undefined8 *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  undefined8 *local_100;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined8 *local_c8;
  undefined8 *local_c0;
  undefined8 *local_b8;
  undefined8 *local_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 *local_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 *local_60;
  undefined8 *local_58;
  undefined8 *local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined8 *local_30;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_1ab0 = in_RSI;
  local_1aa8 = in_RCX;
  local_1aa0 = in_RDX;
  Light_SampleRes::Light_SampleRes(in_RDI);
  local_1a80 = &local_1ad0;
  local_1a88 = local_1aa8;
  local_1ad0 = *local_1aa8;
  local_1acc = local_1aa8[1];
  cosineSampleHemisphere(in_stack_ffffffffffffe4e0);
  local_19a0 = (undefined1 (*) [16])(local_1aa0 + 0x40);
  local_1998 = &local_1b18;
  local_1868 = *(float *)(local_1aa0 + 0x48);
  local_186c = -*(float *)(local_1aa0 + 0x44);
  local_18d8 = &local_19b8;
  local_1864 = 0;
  local_183c = 0;
  local_1848 = 0;
  local_1858 = (ulong)(uint)local_1868 << 0x20;
  uStack_1850 = (ulong)(uint)local_186c;
  local_187c = -*(float *)(local_1aa0 + 0x48);
  local_1884 = *(float *)*local_19a0;
  local_18f8 = &local_19c8;
  local_1880 = 0;
  local_181c = 0;
  local_1824 = 0;
  local_1838 = (ulong)(uint)local_187c;
  uStack_1830 = (ulong)(uint)local_1884;
  local_1808 = &local_18e8;
  local_16d8 = 0;
  fStack_16d4 = local_1868 * local_1868;
  fStack_16d0 = local_186c * local_186c;
  uStack_16cc = 0;
  local_14f8 = (ulong)(uint)fStack_16d4 << 0x20;
  uStack_14f0 = (ulong)(uint)fStack_16d0;
  local_14e8 = &local_15b8;
  local_14c8 = &local_15c8;
  local_13b8 = CONCAT44(fStack_16d4,fStack_16d4);
  uStack_13b0 = CONCAT44(fStack_16d4,fStack_16d4);
  local_14a8 = &local_15d8;
  local_12c8 = CONCAT44(fStack_16d0,fStack_16d0);
  uStack_12c0 = CONCAT44(fStack_16d0,fStack_16d0);
  local_1438 = &local_15f8;
  local_13f8 = fStack_16d4 + 0.0;
  fStack_13f4 = fStack_16d4 + fStack_16d4;
  fStack_13f0 = fStack_16d0 + fStack_16d4;
  fStack_13ec = fStack_16d4 + 0.0;
  local_11e8 = CONCAT44(fStack_13f4,local_13f8);
  uStack_11e0 = CONCAT44(fStack_13ec,fStack_13f0);
  local_1430 = &local_15e8;
  local_1428 = local_13f8 + fStack_16d0;
  fStack_1424 = fStack_13f4 + fStack_16d0;
  fStack_1420 = fStack_13f0 + fStack_16d0;
  fStack_141c = fStack_13ec + fStack_16d0;
  local_1598 = CONCAT44(fStack_1424,local_1428);
  uStack_1590 = CONCAT44(fStack_141c,fStack_1420);
  local_17f0 = &local_1908;
  local_16f8 = local_187c * local_187c;
  uStack_16f4 = 0;
  fStack_16f0 = local_1884 * local_1884;
  uStack_16ec = 0;
  local_1518 = (ulong)(uint)local_16f8;
  uStack_1510 = (ulong)(uint)fStack_16f0;
  local_1500 = &local_1548;
  local_14d8 = &local_1558;
  local_1388 = 0;
  uStack_1380 = 0;
  local_14b8 = &local_1568;
  local_1268 = CONCAT44(fStack_16f0,fStack_16f0);
  uStack_1260 = CONCAT44(fStack_16f0,fStack_16f0);
  local_1498 = &local_1588;
  local_1458 = local_16f8 + 0.0;
  uStack_1454 = 0;
  fStack_1450 = fStack_16f0 + 0.0;
  uStack_144c = 0;
  local_11a8 = (ulong)(uint)local_1458;
  uStack_11a0 = (ulong)(uint)fStack_1450;
  local_1490 = &local_1578;
  local_1488 = local_1458 + fStack_16f0;
  fStack_1484 = fStack_16f0 + 0.0;
  fStack_1480 = fStack_1450 + fStack_16f0;
  fStack_147c = fStack_16f0 + 0.0;
  local_1528 = CONCAT44(fStack_1484,local_1488);
  uStack_1520 = CONCAT44(fStack_147c,fStack_1480);
  local_a11 = local_1488 < local_1428;
  local_a10 = &local_19e8;
  local_a20 = &local_19b8;
  local_a28 = &local_19c8;
  if ((bool)local_a11) {
    local_538 = 0;
    uStack_530 = 0;
    local_548 = 0;
    uStack_540 = 0;
    local_558 = 0;
    uStack_550 = 0;
    local_568 = 0;
    uStack_560 = 0;
    local_9e8 = 0xffffffff;
    uStack_9e4 = 0xffffffff;
    uStack_9e0 = 0xffffffff;
    uStack_9dc = 0xffffffff;
    local_1b48 = 0xffffffffffffffff;
    uStackY_1b40 = 0xffffffffffffffff;
  }
  else {
    local_528 = 0;
    uStack_520 = 0;
    local_1b48 = 0;
    uStackY_1b40 = 0;
  }
  local_a38 = local_1b48;
  uStack_a30 = uStackY_1b40;
  local_518 = local_1b48;
  uStack_510 = uStackY_1b40;
  local_4b8 = local_1b48;
  uStack_4b0 = uStackY_1b40;
  local_4d8 = local_1b48 & local_1858;
  uStack_4d0 = uStackY_1b40 & uStack_1850;
  local_498 = local_1b48;
  uStack_490 = uStackY_1b40;
  local_4e8 = ~local_1b48 & local_1838;
  uStack_4e0 = ~uStackY_1b40 & uStack_1830;
  local_cf8 = local_4d8 | local_4e8;
  uStack_cf0 = uStack_4d0 | uStack_4e0;
  local_da8 = &local_19e8;
  local_da0 = &local_19d8;
  local_d28 = &local_d68;
  local_cd8._0_4_ = (float)local_4e8;
  local_cd8._4_4_ = (float)(local_4d8 >> 0x20);
  uStack_cd0._0_4_ = (float)uStack_cf0;
  local_ca8 = (float)local_cd8 * (float)local_cd8;
  fStack_ca4 = local_cd8._4_4_ * local_cd8._4_4_;
  fStack_ca0 = (float)uStack_cd0 * (float)uStack_cd0;
  uStack_c9c = 0;
  local_c18 = CONCAT44(fStack_ca4,local_ca8);
  uStack_c10 = (ulong)(uint)fStack_ca0;
  local_c08 = &local_c48;
  local_bf8 = &local_c58;
  local_b68 = CONCAT44(fStack_ca4,fStack_ca4);
  uStack_b60 = CONCAT44(fStack_ca4,fStack_ca4);
  local_be8 = &local_c68;
  local_ae8 = CONCAT44(fStack_ca0,fStack_ca0);
  uStack_ae0 = CONCAT44(fStack_ca0,fStack_ca0);
  local_bd8 = &local_c88;
  local_b98 = local_ca8 + fStack_ca4;
  fStack_b94 = fStack_ca4 + fStack_ca4;
  fStack_b90 = fStack_ca0 + fStack_ca4;
  fStack_b8c = fStack_ca4 + 0.0;
  local_a68 = CONCAT44(fStack_b94,local_b98);
  uStack_a60 = CONCAT44(fStack_b8c,fStack_b90);
  local_bd0 = &local_c78;
  local_bc8 = local_b98 + fStack_ca0;
  fStack_bc4 = fStack_b94 + fStack_ca0;
  fStack_bc0 = fStack_b90 + fStack_ca0;
  fStack_bbc = fStack_b8c + fStack_ca0;
  local_c28 = CONCAT44(fStack_bc4,local_bc8);
  uStack_c20 = CONCAT44(fStack_bbc,fStack_bc0);
  local_7e8 = ZEXT416((uint)local_bc8);
  local_848 = CONCAT44(0,local_bc8);
  uStack_840 = 0;
  uStack_5b0 = 0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_848;
  local_858 = rsqrtss(auVar3,auVar3);
  local_7ec = 0x3fc00000;
  local_808 = ZEXT416(0x3fc00000);
  local_738 = local_858._0_8_;
  uVar6 = local_738;
  uStack_730 = local_858._8_8_;
  local_738._0_4_ = local_858._0_4_;
  local_728 = (ulong)(uint)((float)local_738 * 1.5);
  uStack_720 = 0;
  local_80c = 0xbf000000;
  local_828 = ZEXT416(0xbf000000);
  local_758 = local_828._0_8_;
  uStack_750 = 0;
  local_748 = (ulong)(uint)(local_bc8 * -0.5);
  uStack_740 = 0;
  local_778 = local_858._0_8_;
  uStack_770 = local_858._8_8_;
  local_d7c = local_bc8 * -0.5 * (float)local_738;
  local_768 = (ulong)(uint)local_d7c;
  uStack_760 = 0;
  local_798 = local_858._0_8_;
  uStack_790 = local_858._8_8_;
  local_788 = CONCAT44(local_858._4_4_,(float)local_738 * (float)local_738);
  uStack_780 = local_858._8_8_;
  local_7b8 = local_788;
  uStack_7b0 = local_858._8_8_;
  local_d7c = local_d7c * (float)local_738 * (float)local_738;
  local_7a8 = (ulong)(uint)local_d7c;
  uStack_7a0 = 0;
  local_588 = local_7a8;
  uStack_580 = 0;
  local_d7c = (float)local_738 * 1.5 + local_d7c;
  local_578 = (ulong)(uint)local_d7c;
  uStack_570 = 0;
  local_868 = local_578;
  uStack_860 = 0;
  local_7c8 = local_578;
  uStack_7c0 = 0;
  local_d40 = &local_d98;
  local_d08 = CONCAT44(local_d7c,local_d7c);
  uStack_d00 = CONCAT44(local_d7c,local_d7c);
  local_cc8 = (float)local_cd8 * local_d7c;
  fStack_cc4 = local_cd8._4_4_ * local_d7c;
  fStack_cc0 = (float)uStack_cd0 * local_d7c;
  fStack_cbc = local_d7c * 0.0;
  local_1118 = &local_1a08;
  local_908 = *(undefined8 *)*local_19a0;
  uStack_900 = *(undefined8 *)(local_1aa0 + 0x48);
  local_8f0 = &local_958;
  auVar5._8_8_ = uStack_19d0;
  auVar5._0_8_ = local_19d8;
  local_8d0 = local_978;
  local_3c0 = &local_968;
  fStack_2f0 = (float)local_19d8;
  auVar9._12_4_ = (float)((ulong)uStack_19d0 >> 0x20);
  auVar9._0_8_ = auVar5._4_8_;
  auVar9._8_4_ = fStack_2f0;
  local_398._8_8_ = auVar9._8_8_;
  uStack_3b0 = local_398._8_8_;
  uStack_960 = local_398._8_8_;
  local_8c8 = *(undefined8 *)*local_19a0;
  uStack_8c0 = *(undefined8 *)(local_1aa0 + 0x48);
  auVar12 = *local_19a0;
  local_8b0 = &local_998;
  local_420 = &local_988;
  auVar10._12_4_ = (float)((ulong)uStack_8c0 >> 0x20);
  auVar10._0_8_ = auVar12._4_8_;
  auVar10._8_4_ = (float)local_8c8;
  local_3f8._8_8_ = auVar10._8_8_;
  uStack_410 = local_3f8._8_8_;
  uStack_980 = local_3f8._8_8_;
  local_898 = local_9a8;
  local_350 = &local_9d8;
  uStack_2a0 = local_3f8._8_8_;
  local_2a8._0_4_ = auVar12._4_4_;
  local_2a8._4_4_ = auVar12._8_4_;
  fStack_2b4 = (float)((ulong)local_19d8 >> 0x20);
  fStack_2b0 = (float)uStack_19d0;
  local_298 = (float)local_2a8 * fStack_2f0;
  fStack_294 = local_2a8._4_4_ * fStack_2b4;
  fStack_290 = (float)local_8c8 * fStack_2b0;
  fStack_28c = auVar10._12_4_ * auVar9._12_4_;
  local_488 = &local_9c8;
  local_320 = &local_368;
  uStack_310 = local_398._8_8_;
  local_308._0_4_ = (float)local_908;
  local_308._4_4_ = (float)((ulong)local_908 >> 0x20);
  uStack_300._0_4_ = (float)uStack_900;
  uStack_300._4_4_ = (float)((ulong)uStack_900 >> 0x20);
  local_2f8 = (float)local_308 * fStack_2b4;
  fStack_2f4 = local_308._4_4_ * fStack_2b0;
  fStack_2f0 = (float)uStack_300 * fStack_2f0;
  fStack_2ec = uStack_300._4_4_ * auVar9._12_4_;
  local_218 = CONCAT44(fStack_2f4,local_2f8);
  uStack_210 = CONCAT44(fStack_2ec,fStack_2f0);
  local_228 = (float)local_9d8;
  fStack_224 = (float)((ulong)local_9d8 >> 0x20);
  fStack_220 = (float)uStack_9d0;
  fStack_21c = (float)((ulong)uStack_9d0 >> 0x20);
  local_258 = local_2f8 - local_228;
  fStack_254 = fStack_2f4 - fStack_224;
  fStack_250 = fStack_2f0 - fStack_220;
  auVar11._12_4_ = fStack_2ec - fStack_21c;
  local_448 = CONCAT44(fStack_254,local_258);
  uStack_440 = CONCAT44(auVar11._12_4_,fStack_250);
  local_890 = &local_9b8;
  auVar4._8_8_ = uStack_440;
  auVar4._0_8_ = local_448;
  auVar11._0_8_ = auVar4._4_8_;
  auVar11._8_4_ = local_258;
  local_458._8_8_ = auVar11._8_8_;
  uStack_470 = local_458._8_8_;
  uStack_9b0 = local_458._8_8_;
  uStack_920 = local_458._8_8_;
  uStack_1a00 = local_458._8_8_;
  local_1110 = &local_19f8;
  local_1098 = &local_10d8;
  uStack_1040 = local_458._8_8_;
  uStack_1050 = local_458._8_8_;
  local_1018 = fStack_254 * fStack_254;
  fStack_1014 = fStack_250 * fStack_250;
  fStack_1010 = local_258 * local_258;
  fStack_100c = auVar11._12_4_ * auVar11._12_4_;
  local_f88 = CONCAT44(fStack_1014,local_1018);
  uStack_f80 = CONCAT44(fStack_100c,fStack_1010);
  local_f78 = &local_fb8;
  local_f68 = &local_fc8;
  local_ed8 = CONCAT44(fStack_1014,fStack_1014);
  uStack_ed0 = CONCAT44(fStack_1014,fStack_1014);
  local_f58 = &local_fd8;
  local_e58 = CONCAT44(fStack_1010,fStack_1010);
  uStack_e50 = CONCAT44(fStack_1010,fStack_1010);
  local_f48 = &local_ff8;
  local_f08 = local_1018 + fStack_1014;
  fStack_f04 = fStack_1014 + fStack_1014;
  fStack_f00 = fStack_1010 + fStack_1014;
  fStack_efc = fStack_100c + fStack_1014;
  local_dd8 = CONCAT44(fStack_f04,local_f08);
  uStack_dd0 = CONCAT44(fStack_efc,fStack_f00);
  local_f40 = &local_fe8;
  local_f38 = local_f08 + fStack_1010;
  fStack_f34 = fStack_f04 + fStack_1010;
  fStack_f30 = fStack_f00 + fStack_1010;
  fStack_f2c = fStack_efc + fStack_1010;
  local_f98 = CONCAT44(fStack_f34,local_f38);
  uStack_f90 = CONCAT44(fStack_f2c,fStack_f30);
  local_698 = ZEXT416((uint)local_f38);
  local_6f8 = CONCAT44(0,local_f38);
  uStack_6f0 = 0;
  uStack_5c0 = 0;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_6f8;
  local_708 = rsqrtss(auVar12,auVar12);
  local_69c = 0x3fc00000;
  local_6b8 = ZEXT416(0x3fc00000);
  local_5e8 = local_708._0_8_;
  uVar7 = local_5e8;
  uStack_5e0 = local_708._8_8_;
  local_5e8._0_4_ = local_708._0_4_;
  local_5d8 = (ulong)(uint)((float)local_5e8 * 1.5);
  uStack_5d0 = 0;
  local_6bc = 0xbf000000;
  local_6d8 = ZEXT416(0xbf000000);
  local_608 = local_6d8._0_8_;
  uStack_600 = 0;
  local_5f8 = (ulong)(uint)(local_f38 * -0.5);
  uStack_5f0 = 0;
  local_628 = local_708._0_8_;
  uStack_620 = local_708._8_8_;
  local_10ec = local_f38 * -0.5 * (float)local_5e8;
  local_618 = (ulong)(uint)local_10ec;
  uStack_610 = 0;
  local_648 = local_708._0_8_;
  uStack_640 = local_708._8_8_;
  local_638 = CONCAT44(local_708._4_4_,(float)local_5e8 * (float)local_5e8);
  uStack_630 = local_708._8_8_;
  local_668 = local_638;
  uStack_660 = local_708._8_8_;
  local_10ec = local_10ec * (float)local_5e8 * (float)local_5e8;
  local_658 = (ulong)(uint)local_10ec;
  uStack_650 = 0;
  local_5a8 = local_658;
  uStack_5a0 = 0;
  local_10ec = (float)local_5e8 * 1.5 + local_10ec;
  local_598 = (ulong)(uint)local_10ec;
  uStack_590 = 0;
  local_718 = local_598;
  uStack_710 = 0;
  local_678 = local_598;
  uStack_670 = 0;
  local_10b0 = &local_1108;
  local_1078 = CONCAT44(local_10ec,local_10ec);
  uStack_1070 = CONCAT44(local_10ec,local_10ec);
  uStack_1060 = local_458._8_8_;
  local_1038 = fStack_254 * local_10ec;
  fStack_1034 = fStack_250 * local_10ec;
  fStack_1030 = local_258 * local_10ec;
  fStack_102c = auVar11._12_4_ * local_10ec;
  local_19f8 = CONCAT44(fStack_1034,local_1038);
  uStack_19f0 = CONCAT44(fStack_102c,fStack_1030);
  local_1a18 = &local_1b18;
  local_1f0 = local_1b08;
  local_200 = &local_1af8;
  uVar1 = *(undefined8 *)*local_19a0;
  uVar2 = *(undefined8 *)(local_1aa0 + 0x48);
  local_1a10 = &local_1ae8;
  local_1a20 = &local_1ac8;
  local_1890 = local_1a38;
  local_18a0 = local_1a58;
  local_128 = local_1b08;
  local_18b0 = local_1a78;
  local_17d0 = &local_1af8;
  local_17c0 = &local_1a68;
  local_17b8 = (float)local_1af8;
  fStack_17b4 = (float)((ulong)local_1af8 >> 0x20);
  fStack_17b0 = (float)uStack_1af0;
  fStack_17ac = (float)((ulong)uStack_1af0 >> 0x20);
  local_1738 = local_1ac8.m128[2] * local_17b8;
  fStack_1734 = local_1ac8.m128[2] * fStack_17b4;
  fStack_1730 = local_1ac8.m128[2] * fStack_17b0;
  fStack_172c = local_1ac8.m128[2] * fStack_17ac;
  local_1c0 = &local_1a48;
  local_100 = &local_148;
  local_f8 = (float)local_1b08._0_8_;
  fStack_f4 = SUB84(local_1b08._0_8_,4);
  fStack_f0 = (float)local_1b08._8_8_;
  fStack_ec = SUB84(local_1b08._8_8_,4);
  local_d8 = local_1ac8.m128[1] * local_f8;
  fStack_d4 = local_1ac8.m128[1] * fStack_f4;
  fStack_d0 = local_1ac8.m128[1] * fStack_f0;
  fStack_cc = local_1ac8.m128[1] * fStack_ec;
  local_78 = CONCAT44(fStack_d4,local_d8);
  uStack_70 = CONCAT44(fStack_cc,fStack_d0);
  local_88 = (float)local_1a68;
  fStack_84 = (float)((ulong)local_1a68 >> 0x20);
  fStack_80 = (float)uStack_1a60;
  fStack_7c = (float)((ulong)uStack_1a60 >> 0x20);
  local_a8 = local_d8 + local_88;
  fStack_a4 = fStack_d4 + fStack_84;
  fStack_a0 = fStack_d0 + fStack_80;
  fStack_9c = fStack_cc + fStack_7c;
  local_190 = &local_1d8;
  local_188 = (float)local_1b18;
  fStack_184 = (float)((ulong)local_1b18 >> 0x20);
  fStack_180 = (float)uStack_1b10;
  fStack_17c = (float)((ulong)uStack_1b10 >> 0x20);
  local_168 = local_1ac8.m128[0] * local_188;
  fStack_164 = local_1ac8.m128[0] * fStack_184;
  fStack_160 = local_1ac8.m128[0] * fStack_180;
  fStack_15c = local_1ac8.m128[0] * fStack_17c;
  local_18 = CONCAT44(fStack_164,local_168);
  uStack_10 = CONCAT44(fStack_15c,fStack_160);
  local_28 = (float)local_1a48;
  fStack_24 = (float)((ulong)local_1a48 >> 0x20);
  fStack_20 = (float)uStack_1a40;
  fStack_1c = (float)((ulong)uStack_1a40 >> 0x20);
  local_48 = local_168 + local_28;
  fStack_44 = fStack_164 + fStack_24;
  fStack_40 = fStack_160 + fStack_20;
  fStack_3c = fStack_15c + fStack_1c;
  local_1ae8 = CONCAT44(fStack_44,local_48);
  uStack_1ae0 = CONCAT44(fStack_3c,fStack_40);
  local_1978 = &in_RDI->dir;
  *(undefined8 *)&local_1978->field_0 = local_1ae8;
  *(undefined8 *)((long)&(in_RDI->dir).field_0 + 8) = uStack_1ae0;
  local_1980 = local_1a10;
  local_18f0 = local_18f8;
  local_18d0 = local_18d8;
  local_1878 = local_18f8;
  local_1860 = local_18d8;
  local_1844 = local_1868;
  local_1840 = local_186c;
  local_1828 = local_187c;
  local_1820 = local_1884;
  local_1818 = local_18d8;
  local_1810 = local_18d8;
  local_1800 = local_18f8;
  local_17f8 = local_18f8;
  local_17c8 = local_18b0;
  local_1778 = local_1838;
  uStack_1770 = uStack_1830;
  local_1768 = local_1838;
  uStack_1760 = uStack_1830;
  local_1758 = local_1858;
  uStack_1750 = uStack_1850;
  local_1748 = local_1858;
  uStack_1740 = uStack_1850;
  local_1720 = local_17c0;
  local_16e0 = local_17f0;
  local_16c0 = local_1808;
  local_15a0 = local_1808;
  local_1530 = local_17f0;
  local_14e0 = local_1500;
  local_14d0 = local_14e8;
  local_14c0 = local_1500;
  local_14b0 = local_14e8;
  local_14a0 = local_14b8;
  local_1478 = local_1490;
  local_1470 = local_14d8;
  local_1468 = local_1500;
  local_1460 = local_1498;
  local_1448 = local_1498;
  local_1440 = local_14a8;
  local_1418 = local_1430;
  local_1410 = local_14c8;
  local_1408 = local_14e8;
  local_1400 = local_1438;
  local_13e0 = local_1438;
  local_13d8 = local_1490;
  local_13d0 = local_1430;
  local_13c8 = local_14e8;
  local_13c0 = local_14c8;
  local_13a0 = local_14c8;
  local_1398 = local_1500;
  local_1390 = local_14d8;
  local_1370 = local_14d8;
  local_1368 = uStack_16f4;
  uStack_1364 = uStack_16f4;
  uStack_1360 = uStack_16f4;
  uStack_135c = uStack_16f4;
  local_1358 = fStack_16d4;
  fStack_1354 = fStack_16d4;
  fStack_1350 = fStack_16d4;
  fStack_134c = fStack_16d4;
  local_1348 = local_1518;
  uStack_1340 = uStack_1510;
  local_1338 = local_14f8;
  uStack_1330 = uStack_14f0;
  local_1328 = local_1500;
  local_1320 = local_14e8;
  local_1318 = local_14c8;
  local_1310 = local_14e8;
  local_1308 = local_14a8;
  local_1300 = local_1438;
  local_12f8 = local_14d8;
  local_12f0 = local_1500;
  local_12e8 = local_14b8;
  local_12e0 = local_1498;
  local_12d8 = local_14e8;
  local_12d0 = local_14a8;
  local_12b0 = local_14a8;
  local_12a8 = fStack_16d0;
  fStack_12a4 = fStack_16d0;
  fStack_12a0 = fStack_16d0;
  fStack_129c = fStack_16d0;
  local_1298 = local_14f8;
  uStack_1290 = uStack_14f0;
  local_1280 = local_14e8;
  local_1278 = local_1500;
  local_1270 = local_14b8;
  local_1250 = local_14b8;
  local_1248 = fStack_16f0;
  fStack_1244 = fStack_16f0;
  fStack_1240 = fStack_16f0;
  fStack_123c = fStack_16f0;
  local_1238 = local_1518;
  uStack_1230 = uStack_1510;
  local_1220 = local_1500;
  local_1218 = local_13b8;
  uStack_1210 = uStack_13b0;
  local_1208 = local_14f8;
  uStack_1200 = uStack_14f0;
  local_11f8 = local_12c8;
  uStack_11f0 = uStack_12c0;
  local_11d8 = local_1388;
  uStack_11d0 = uStack_1380;
  local_11c8 = local_1518;
  uStack_11c0 = uStack_1510;
  local_11b8 = local_1268;
  uStack_11b0 = uStack_1260;
  local_10e8 = local_1118;
  local_10e0 = local_1110;
  local_10c8 = local_1118;
  local_10c0 = local_1118;
  local_10b4 = local_10ec;
  local_10a8 = local_1118;
  local_10a0 = local_1118;
  local_1090 = local_10b0;
  local_1088 = local_1118;
  local_1080 = local_1110;
  local_1068 = auVar11._0_8_;
  local_1058 = auVar11._0_8_;
  local_1048 = auVar11._0_8_;
  local_1020 = local_1110;
  local_1000 = local_1098;
  local_fa0 = local_1098;
  local_f70 = local_f78;
  local_f60 = local_f78;
  local_f50 = local_f58;
  local_f28 = local_f40;
  local_f20 = local_f68;
  local_f18 = local_f78;
  local_f10 = local_f48;
  local_ef8 = local_f48;
  local_ef0 = local_f40;
  local_ee8 = local_f78;
  local_ee0 = local_f68;
  local_ec0 = local_f68;
  local_eb8 = fStack_1014;
  fStack_eb4 = fStack_1014;
  fStack_eb0 = fStack_1014;
  fStack_eac = fStack_1014;
  local_ea8 = local_f88;
  uStack_ea0 = uStack_f80;
  local_e90 = local_f78;
  local_e88 = local_f68;
  local_e80 = local_f78;
  local_e78 = local_f58;
  local_e70 = local_f48;
  local_e68 = local_f78;
  local_e60 = local_f58;
  local_e40 = local_f58;
  local_e38 = fStack_1010;
  fStack_e34 = fStack_1010;
  fStack_e30 = fStack_1010;
  fStack_e2c = fStack_1010;
  local_e28 = local_f88;
  uStack_e20 = uStack_f80;
  local_e10 = local_f78;
  local_e08 = local_ed8;
  uStack_e00 = uStack_ed0;
  local_df8 = local_f88;
  uStack_df0 = uStack_f80;
  local_de8 = local_e58;
  uStack_de0 = uStack_e50;
  local_dc8 = local_10ec;
  fStack_dc4 = local_10ec;
  fStack_dc0 = local_10ec;
  fStack_dbc = local_10ec;
  local_dac = local_10ec;
  local_d78 = local_da8;
  local_d70 = local_da0;
  local_d58 = local_da8;
  local_d50 = local_da8;
  local_d44 = local_d7c;
  local_d38 = local_da8;
  local_d30 = local_da8;
  local_d20 = local_d40;
  local_d18 = local_da8;
  local_d10 = local_da0;
  local_ce8 = local_cf8;
  uStack_ce0 = uStack_cf0;
  local_cd8 = local_cf8;
  uStack_cd0 = uStack_cf0;
  local_cb0 = local_da0;
  local_c90 = local_d28;
  local_c30 = local_d28;
  local_c00 = local_c08;
  local_bf0 = local_c08;
  local_be0 = local_be8;
  local_bb8 = local_bd0;
  local_bb0 = local_bf8;
  local_ba8 = local_c08;
  local_ba0 = local_bd8;
  local_b88 = local_bd8;
  local_b80 = local_bd0;
  local_b78 = local_c08;
  local_b70 = local_bf8;
  local_b50 = local_bf8;
  local_b48 = fStack_ca4;
  fStack_b44 = fStack_ca4;
  fStack_b40 = fStack_ca4;
  fStack_b3c = fStack_ca4;
  local_b38 = local_c18;
  uStack_b30 = uStack_c10;
  local_b20 = local_c08;
  local_b18 = local_bf8;
  local_b10 = local_c08;
  local_b08 = local_be8;
  local_b00 = local_bd8;
  local_af8 = local_c08;
  local_af0 = local_be8;
  local_ad0 = local_be8;
  local_ac8 = fStack_ca0;
  fStack_ac4 = fStack_ca0;
  fStack_ac0 = fStack_ca0;
  fStack_abc = fStack_ca0;
  local_ab8 = local_c18;
  uStack_ab0 = uStack_c10;
  local_aa0 = local_c08;
  local_a98 = local_b68;
  uStack_a90 = uStack_b60;
  local_a88 = local_c18;
  uStack_a80 = uStack_c10;
  local_a78 = local_ae8;
  uStack_a70 = uStack_ae0;
  local_a58 = local_d7c;
  fStack_a54 = local_d7c;
  fStack_a50 = local_d7c;
  fStack_a4c = local_d7c;
  local_a3c = local_d7c;
  local_a08 = local_cf8;
  uStack_a00 = uStack_cf0;
  local_9f0 = local_da8;
  local_940 = local_da0;
  local_938 = local_19a0;
  local_930 = local_1118;
  local_928 = auVar11._0_8_;
  local_910 = local_1118;
  local_888 = local_19a0;
  local_880 = local_1110;
  local_878 = local_da0;
  local_870 = local_1a18;
  local_82c = local_bc8;
  local_7cc = local_bc8;
  local_738 = uVar6;
  local_6dc = local_f38;
  local_67c = local_f38;
  local_5e8 = uVar7;
  local_5c8 = local_6f8;
  local_5b8 = local_848;
  local_508 = local_1858;
  uStack_500 = uStack_1850;
  local_4f8 = local_1838;
  uStack_4f0 = uStack_1830;
  local_4c8 = local_1858;
  uStack_4c0 = uStack_1850;
  local_4a8 = local_1838;
  uStack_4a0 = uStack_1830;
  local_480 = local_890;
  local_478 = auVar11._0_8_;
  local_460 = local_890;
  local_458 = auVar11;
  local_430 = local_488;
  local_428 = local_8b0;
  local_418 = auVar10._0_8_;
  local_400 = local_420;
  local_3f8 = auVar10;
  local_3e8 = local_8c8;
  uStack_3e0 = uStack_8c0;
  local_3d0 = local_8b0;
  local_3c8 = local_8d0;
  local_3b8 = auVar9._0_8_;
  local_3a0 = local_3c0;
  local_398 = auVar9;
  local_370 = local_8d0;
  local_348 = local_3c0;
  local_340 = local_8f0;
  local_338 = local_488;
  local_330 = local_3c0;
  local_328 = local_8f0;
  local_318 = auVar9._0_8_;
  local_308 = local_908;
  uStack_300 = uStack_900;
  local_2e8 = local_320;
  local_2e0 = local_3c0;
  local_2d8 = local_8f0;
  local_2d0 = local_898;
  local_2c8 = local_420;
  local_2c0 = local_350;
  local_2a8 = auVar10._0_8_;
  local_288 = local_350;
  local_280 = local_898;
  local_278 = local_420;
  local_270 = local_350;
  local_268 = local_320;
  local_260 = local_488;
  fStack_24c = auVar11._12_4_;
  local_240 = local_488;
  local_238 = local_350;
  local_230 = local_320;
  local_208 = local_19a0;
  local_1f8 = local_1110;
  local_1e8 = local_da0;
  local_1e0 = local_1a18;
  local_1b8 = local_1a18;
  local_1b0 = local_1890;
  local_1a8 = local_1a10;
  local_1a0 = local_1a18;
  local_198 = local_1890;
  local_150 = local_190;
  local_130 = local_17c0;
  local_120 = local_18a0;
  local_118 = local_1c0;
  local_110 = local_128;
  local_108 = local_18a0;
  local_c8 = local_100;
  local_c0 = local_17c0;
  local_b8 = local_100;
  local_b0 = local_1c0;
  local_90 = local_1c0;
  local_60 = local_1c0;
  local_58 = local_190;
  local_50 = local_1a10;
  local_30 = local_1a10;
  local_1b18 = CONCAT44(fStack_cc4,local_cc8);
  uStack_1b10 = CONCAT44(fStack_cbc,fStack_cc0);
  local_1af8 = uVar1;
  uStack_1af0 = uVar2;
  local_1a68 = CONCAT44(fStack_1734,local_1738);
  uStack_1a60 = CONCAT44(fStack_172c,fStack_1730);
  local_1a48 = CONCAT44(fStack_a4,local_a8);
  uStack_1a40 = CONCAT44(fStack_9c,fStack_a0);
  local_1a08 = auVar11._0_8_;
  local_19e8 = local_cf8;
  uStack_19e0 = uStack_cf0;
  local_19d8 = CONCAT44(fStack_cc4,local_cc8);
  uStack_19d0 = CONCAT44(fStack_cbc,fStack_cc0);
  local_19c8 = local_1838;
  uStack_19c0 = uStack_1830;
  local_19b8 = local_1858;
  uStack_19b0 = uStack_1850;
  local_1908 = local_1518;
  uStack_1900 = uStack_1510;
  local_18e8 = local_14f8;
  uStack_18e0 = uStack_14f0;
  local_15f8 = local_11e8;
  uStack_15f0 = uStack_11e0;
  local_15e8 = local_1598;
  uStack_15e0 = uStack_1590;
  local_15d8 = local_12c8;
  uStack_15d0 = uStack_12c0;
  local_15c8 = local_13b8;
  uStack_15c0 = uStack_13b0;
  local_15b8 = local_14f8;
  uStack_15b0 = uStack_14f0;
  local_1588 = local_11a8;
  uStack_1580 = uStack_11a0;
  local_1578 = local_1528;
  uStack_1570 = uStack_1520;
  local_1568 = local_1268;
  uStack_1560 = uStack_1260;
  local_1558 = local_1388;
  uStack_1550 = uStack_1380;
  local_1548 = local_1518;
  uStack_1540 = uStack_1510;
  local_1108 = local_1078;
  uStack_1100 = uStack_1070;
  local_10d8 = local_f88;
  uStack_10d0 = uStack_f80;
  local_ff8 = local_dd8;
  uStack_ff0 = uStack_dd0;
  local_fe8 = local_f98;
  uStack_fe0 = uStack_f90;
  local_fd8 = local_e58;
  uStack_fd0 = uStack_e50;
  local_fc8 = local_ed8;
  uStack_fc0 = uStack_ed0;
  local_fb8 = local_f88;
  uStack_fb0 = uStack_f80;
  local_d98 = local_d08;
  uStack_d90 = uStack_d00;
  local_d68 = local_c18;
  uStack_d60 = uStack_c10;
  local_c88 = local_a68;
  uStack_c80 = uStack_a60;
  local_c78 = local_c28;
  uStack_c70 = uStack_c20;
  local_c68 = local_ae8;
  uStack_c60 = uStack_ae0;
  local_c58 = local_b68;
  uStack_c50 = uStack_b60;
  local_c48 = local_c18;
  uStack_c40 = uStack_c10;
  local_9d8 = CONCAT44(fStack_294,local_298);
  uStack_9d0 = CONCAT44(fStack_28c,fStack_290);
  local_9c8 = local_448;
  uStack_9c0 = uStack_440;
  local_9b8 = auVar11._0_8_;
  local_998 = local_8c8;
  uStack_990 = uStack_8c0;
  local_988 = auVar10._0_8_;
  local_968 = auVar9._0_8_;
  local_958 = local_908;
  uStack_950 = uStack_900;
  local_368 = local_218;
  uStack_360 = uStack_210;
  local_1d8 = local_18;
  uStack_1d0 = uStack_10;
  local_148 = local_78;
  uStack_140 = uStack_70;
  fVar8 = cosineSampleHemispherePDF((Vec3fa *)&local_1a20->field_1);
  in_RDI->pdf = fVar8;
  local_1970 = &inf;
  fVar8 = std::numeric_limits<float>::infinity();
  in_RDI->dist = fVar8;
  fVar8 = in_RDI->pdf;
  auVar12 = rcpss(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8));
  local_1628 = auVar12._0_4_;
  local_1628 = local_1628 * (2.0 - local_1628 * fVar8);
  local_1788 = (float)*(undefined8 *)(local_1ab0 + 0x10);
  fStack_1784 = (float)((ulong)*(undefined8 *)(local_1ab0 + 0x10) >> 0x20);
  fStack_1780 = (float)*(undefined8 *)(local_1ab0 + 0x18);
  fStack_177c = (float)((ulong)*(undefined8 *)(local_1ab0 + 0x18) >> 0x20);
  *(ulong *)&(in_RDI->weight).field_0 = CONCAT44(fStack_1784 * local_1628,local_1788 * local_1628);
  *(ulong *)((long)&(in_RDI->weight).field_0 + 8) =
       CONCAT44(fStack_177c * local_1628,fStack_1780 * local_1628);
  return in_RDI;
}

Assistant:

SYCL_EXTERNAL Light_SampleRes AmbientLight_sample(const Light* super,
                                                                 const DifferentialGeometry& dg,
                                                                 const Vec2f& s)
{
  AmbientLight* self = (AmbientLight*)super;
  Light_SampleRes res;

  const Vec3fa localDir = cosineSampleHemisphere(s);
  res.dir = frame(dg.Ns) * localDir;
  res.pdf = cosineSampleHemispherePDF(localDir);
  res.dist = inf;
  res.weight = self->radiance * rcp(res.pdf);

  return res;
}